

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDwaCompressorSimd.h
# Opt level: O1

void __thiscall Imf_3_2::SimdAlignedBuffer64<float>::alloc(SimdAlignedBuffer64<float> *this)

{
  int iVar1;
  void *ptr;
  float *local_10;
  
  local_10 = (float *)0x0;
  iVar1 = posix_memalign(&local_10,0x20,0x100);
  if (iVar1 != 0) {
    local_10 = (float *)0x0;
  }
  this->_handle = (char *)local_10;
  if (((ulong)local_10 & 0x1f) != 0) {
    free(local_10);
    local_10 = (float *)0x0;
    iVar1 = posix_memalign(&local_10,0x20,0x120);
    if (iVar1 != 0) {
      local_10 = (float *)0x0;
    }
    this->_handle = (char *)local_10;
    local_10 = (float *)((long)local_10 + (ulong)(-(int)local_10 & 0x1f));
  }
  this->_buffer = local_10;
  return;
}

Assistant:

void alloc ()
    {
        //
        // Try EXRAllocAligned first - but it might fallback to
        // unaligned allocs. If so, overalloc.
        //

        _handle = (char*) EXRAllocAligned (64 * sizeof (T), _SSE_ALIGNMENT);

        if (((size_t) _handle & (_SSE_ALIGNMENT - 1)) == 0)
        {
            _buffer = (T*) _handle;
            return;
        }

        EXRFreeAligned (_handle);
        _handle = (char*) EXRAllocAligned (
            64 * sizeof (T) + _SSE_ALIGNMENT, _SSE_ALIGNMENT);

        char* aligned = _handle;

        while ((size_t) aligned & (_SSE_ALIGNMENT - 1))
            aligned++;

        _buffer = (T*) aligned;
    }